

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen_Capture_Example.cpp
# Opt level: O2

vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *
getWindowToCapture(vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>
                   *__return_storage_ptr__,string *window_to_search_for)

{
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  size_type sVar8;
  pointer __x;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *filtereditems;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> windows;
  string name;
  locale local_70 [8];
  _Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> local_68;
  long local_50;
  long local_48;
  
  SL::Screen_Capture::GetWindows();
  pcVar1 = (window_to_search_for->_M_dataplus)._M_p;
  sVar2 = window_to_search_for->_M_string_length;
  for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
    cVar4 = pcVar1[sVar8];
    std::locale::locale((locale *)&local_50);
    cVar4 = std::tolower<char>(cVar4,(locale *)&local_50);
    std::locale::~locale((locale *)&local_50);
    pcVar1[sVar8] = cVar4;
  }
  (__return_storage_ptr__->
  super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__x = local_68._M_impl.super__Vector_impl_data._M_start;
      __x != local_68._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,__x->Name,(allocator<char> *)local_70);
    lVar3 = local_48;
    lVar5 = local_50;
    for (lVar7 = 0; lVar3 != lVar7; lVar7 = lVar7 + 1) {
      cVar4 = *(char *)(lVar5 + lVar7);
      std::locale::locale(local_70);
      cVar4 = std::tolower<char>(cVar4,local_70);
      std::locale::~locale(local_70);
      *(char *)(lVar5 + lVar7) = cVar4;
    }
    lVar5 = std::__cxx11::string::find((string *)&local_50,(ulong)window_to_search_for);
    if (lVar5 != -1) {
      std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::
      push_back(__return_storage_ptr__,__x);
      poVar6 = std::operator<<((ostream *)&std::cout,"ADDING WINDOW  Height ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(__x->Size).y);
      poVar6 = std::operator<<(poVar6,"  Width  ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(__x->Size).x);
      poVar6 = std::operator<<(poVar6,"   ");
      poVar6 = std::operator<<(poVar6,__x->Name);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::_Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::
  ~_Vector_base(&local_68);
  return __return_storage_ptr__;
}

Assistant:

auto getWindowToCapture(std::string window_to_search_for = "blizzard")
{
    auto windows = SL::Screen_Capture::GetWindows(); 
    // convert to lower case for easier comparisons
    std::transform(window_to_search_for.begin(), window_to_search_for.end(), window_to_search_for.begin(),
                   [](char c) { return std::tolower(c, std::locale()); });
    decltype(windows) filtereditems;
    for (auto &a : windows) {
        std::string name = a.Name;
        std::transform(name.begin(), name.end(), name.begin(), [](char c) { return std::tolower(c, std::locale()); });
        if (name.find(window_to_search_for) != std::string::npos) {
            filtereditems.push_back(a);
            std::cout << "ADDING WINDOW  Height " << a.Size.y << "  Width  " << a.Size.x << "   " << a.Name << std::endl;
        }
    }

    return filtereditems;
}